

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_diag_m2(REF_DBL *m,REF_DBL *d)

{
  undefined8 uVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (0x7fefffffffffffff < (ulong)ABS(*m)) {
    return 3;
  }
  dVar8 = m[1];
  if (0x7fefffffffffffff < (ulong)ABS(dVar8)) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[2])) {
    return 3;
  }
  dVar7 = (*m - m[2]) * 0.5;
  dVar9 = dVar7;
  if (dVar7 <= -dVar7) {
    dVar9 = -dVar7;
  }
  dVar4 = dVar8;
  if (dVar8 <= -dVar8) {
    dVar4 = -dVar8;
  }
  dVar6 = dVar9;
  if (dVar9 <= dVar4) {
    dVar6 = dVar4;
  }
  dVar5 = dVar6 * 1e+20;
  if (dVar5 <= -dVar5) {
    dVar5 = -dVar5;
  }
  dVar3 = -1.0;
  if (dVar5 <= dVar9) {
    dVar9 = 0.0;
  }
  else {
    dVar9 = 0.0;
    if (dVar4 < dVar5) {
      dVar7 = dVar7 / dVar6;
      dVar8 = dVar8 / dVar6;
      dVar9 = dVar7 * dVar7 + dVar8 * dVar8;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar4 = dVar9 * 1e+20;
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      dVar6 = dVar7;
      if (dVar7 <= -dVar7) {
        dVar6 = -dVar7;
      }
      if (dVar4 <= dVar6) {
        pcVar2 = "c2/l";
        uVar1 = 0x115;
      }
      else {
        dVar6 = dVar8;
        if (dVar8 <= -dVar8) {
          dVar6 = -dVar8;
        }
        if (dVar6 < dVar4) {
          dVar3 = dVar7 / dVar9;
          dVar9 = dVar8 / dVar9;
          if (0.0 < dVar3) {
            dVar3 = -dVar3;
            dVar9 = -dVar9;
          }
          goto LAB_0017f17e;
        }
        pcVar2 = "s2/l";
        uVar1 = 0x116;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             uVar1,"ref_matrix_diag_m2",pcVar2);
      return 1;
    }
  }
LAB_0017f17e:
  dVar8 = (1.0 - dVar3) * 0.5;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar4 = (dVar9 * 0.5) / dVar8;
  dVar7 = m[1];
  *d = *m * dVar8 * dVar8 + (m[2] * dVar4 * dVar4 - dVar9 * dVar7);
  d[1] = dVar8 * dVar8 * m[2] + dVar4 * dVar4 * *m + dVar9 * dVar7;
  d[2] = dVar8;
  d[3] = -dVar4;
  d[4] = dVar4;
  d[5] = dVar8;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_m2(REF_DBL *m, REF_DBL *d) {
  REF_DBL c2, s2, norm, l, c, s, cc, ss, mid;
  /* if inf or nan */
  if (!isfinite(m[0]) || !isfinite(m[1]) || !isfinite(m[2])) {
    return REF_INVALID;
  }

  /* one rotation ( zero out m[2] ) */
  /* http://www.geometrictools.com/Documentation/ */
  /* Eigen System Solvers for Symmetric Matrices, David Eberly */

  c2 = 0.5 * (m[0] - m[2]);
  s2 = m[1];
  norm = MAX(ABS(c2), ABS(s2));

  if (ref_math_divisible(c2, norm) && ref_math_divisible(s2, norm)) {
    c2 /= norm;
    s2 /= norm;
    l = sqrt(c2 * c2 + s2 * s2);
    RAS(ref_math_divisible(c2, l), "c2/l");
    RAS(ref_math_divisible(s2, l), "s2/l");
    c2 /= l;
    s2 /= l;
    if (c2 > 0.0) {
      c2 = -c2;
      s2 = -s2;
    }
  } else {
    c2 = -1.0;
    s2 = 0.0;
  }

  s = sqrt(0.5 * (1.0 - c2));
  c = 0.5 * s2 / s;
  cc = c * c;
  ss = s * s;
  mid = s2 * m[1];

  /*
  printf("  m00 %f m01 %f m11 %f\n", m[0], m[1], m[2]);
  printf("  c2 %f s2 %f c %f s %f\n", c2, s2, c, s);
  printf("  cc %f ss %f mid %f\n", cc, ss, mid);
  printf("  e %f %f %f e %f %f %f\n", cc * m[2], -mid, ss * m[0], cc * m[0],
         mid, ss * m[2]);
  printf("  e %f e %f\n", cc * m[2] - mid + ss * m[0],
         cc * m[0] + mid + ss * m[2]);
  */

  ref_matrix_eig2(d, 0) = cc * m[2] - mid + ss * m[0];
  ref_matrix_eig2(d, 1) = cc * m[0] + mid + ss * m[2];

  ref_matrix_vec2(d, 0, 0) = s;
  ref_matrix_vec2(d, 1, 0) = -c;

  ref_matrix_vec2(d, 0, 1) = c;
  ref_matrix_vec2(d, 1, 1) = s;

  return REF_SUCCESS;
}